

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::change_var_parent(Var **var,Var *target,Var *new_var)

{
  VarType VVar1;
  undefined1 local_30 [8];
  shared_ptr<kratos::Expr> expr;
  
  VVar1 = (*var)->type_;
  if (VVar1 == Expression) {
    Var::as<kratos::Expr>((Var *)local_30);
    change_var_expr((shared_ptr<kratos::Expr> *)local_30,target,new_var,true);
  }
  else {
    if (VVar1 != BaseCasted) {
      if (VVar1 != Slice) {
        return;
      }
      set_slice_var_parent(var,target,new_var,true);
      return;
    }
    Var::as<kratos::VarCasted>((Var *)local_30);
    change_cast_parent((shared_ptr<kratos::VarCasted> *)local_30,target,new_var);
  }
  if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void change_var_parent(Var *&var, Var *target, Var *new_var) {
    if (var->type() == VarType::Slice) {
        set_slice_var_parent(var, target, new_var, true);
    } else if (var->type() == VarType::Expression) {
        auto expr = var->as<Expr>();
        change_var_expr(expr, target, new_var);
    } else if (var->type() == VarType::BaseCasted) {
        change_cast_parent(var->as<VarCasted>(), target, new_var);
    }
}